

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

int handle_ifdef(dmr_C *C,stream *stream,token **line,token *token)

{
  int true_value;
  
  if (((ulong)token->next->pos & 0x3f) == 2) {
    true_value = token_defined(C,token->next);
  }
  else {
    if ((stream->dirty == 0) && (stream->dirty = 1, stream->ifndef == (token *)0x0)) {
      stream->protect = (ident *)0x0;
    }
    true_value = -1;
    if (C->false_nesting == 0) {
      dmrC_sparse_error(C,token->pos,"expected preprocessor identifier");
    }
  }
  preprocessor_if(C,stream,token,true_value);
  return 0;
}

Assistant:

static int handle_ifdef(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
	struct token *next = token->next;
	int arg;
        
        (void) line;
	if (dmrC_token_type(next) == TOKEN_IDENT) {
		arg = token_defined(C, next);
	} else {
		dirty_stream(stream);
		if (!C->false_nesting)
			dmrC_sparse_error(C, token->pos, "expected preprocessor identifier");
		arg = -1;
	}
	return preprocessor_if(C, stream, token, arg);
}